

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O2

void __thiscall Assimp::LWOImporter::LoadLWO2VertexMap(LWOImporter *this,uint length,bool perPoly)

{
  ReferrerList *this_00;
  uint8_t **inout;
  ushort uVar1;
  uint uVar2;
  uint *puVar3;
  Layer *this_01;
  pointer paVar4;
  pointer paVar5;
  pointer pFVar6;
  pointer pFVar7;
  bool bVar8;
  ushort uVar9;
  uint l;
  uint uVar10;
  int iVar11;
  VMapEntry *base;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  DeadlyImportError *this_02;
  Logger *pLVar15;
  uint uVar16;
  ulong uVar17;
  pointer pFVar18;
  reference rVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string name;
  uint local_1d0;
  uint local_1b0;
  unique_ptr<float[],_std::default_delete<float[]>_> temp;
  
  if (length < 6) {
    this_02 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&temp,"LWO: VMAP chunk is too small",(allocator *)&name);
    DeadlyImportError::DeadlyImportError(this_02,(string *)&temp);
    __cxa_throw(this_02,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar3 = (uint *)this->mFileBuffer;
  uVar2 = *puVar3;
  this->mFileBuffer = (uint8_t *)(puVar3 + 1);
  uVar1 = (ushort)puVar3[1];
  this->mFileBuffer = (uint8_t *)((long)puVar3 + 6);
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  GetS0(this,&name,length);
  uVar9 = uVar1 << 8 | uVar1 >> 8;
  uVar10 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  if (uVar10 == 0x4d4e5657) {
LAB_00406229:
    if (uVar1 != 0x100) {
      pLVar15 = DefaultLogger::get();
      std::operator+(&local_240,"LWO2: Skipping Weight Channel \'",&name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp,
                     &local_240,"\' with !1 components");
      Logger::warn(pLVar15,(char *)temp._M_t.
                                   super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                   super__Head_base<0UL,_float_*,_false>._M_head_impl);
      goto LAB_00406884;
    }
    lVar12 = 0x48;
    if (uVar2 == 0x54484757) {
      lVar12 = 0x30;
    }
    base = FindEntry<Assimp::LWO::WeightChannel>
                     ((vector<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>
                       *)((long)&(this->mCurLayer->mTempPoints).
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar12),&name,perPoly);
  }
  else {
    if (uVar10 == 0x4d4f5246) goto LAB_0040689b;
    if (uVar10 == 0x4e4f524d) {
      bVar8 = std::operator!=(&name,"vert_normals");
      if ((uVar1 != 0x300 || bVar8) ||
         ((this->mCurLayer->mNormals).super_VMapEntry.name._M_string_length != 0))
      goto LAB_0040689b;
      pLVar15 = DefaultLogger::get();
      Logger::info(pLVar15,"Processing non-standard extension: MODO VMAP.NORM.vert_normals");
      std::__cxx11::string::_M_assign((string *)&(this->mCurLayer->mNormals).super_VMapEntry.name);
      base = &(this->mCurLayer->mNormals).super_VMapEntry;
    }
    else {
      if (uVar10 == 0x5049434b) goto LAB_0040689b;
      if ((uVar10 == 0x52474220) || (uVar10 == 0x52474241)) {
        if (uVar9 - 5 < 0xfffffffe) {
          pLVar15 = DefaultLogger::get();
          std::operator+(&local_240,"LWO2: Skipping Color Map \'",&name);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp,
                         &local_240,"\' with a dimension > 4 or < 3");
          Logger::warn(pLVar15,(char *)temp._M_t.
                                       super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                                       _M_t.
                                       super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                       .super__Head_base<0UL,_float_*,_false>._M_head_impl);
LAB_00406884:
          std::__cxx11::string::~string((string *)&temp);
          std::__cxx11::string::~string((string *)&local_240);
          goto LAB_0040689b;
        }
        base = FindEntry<Assimp::LWO::VColorChannel>
                         (&this->mCurLayer->mVColorChannels,&name,perPoly);
      }
      else {
        if (uVar10 == 0x53504f54) goto LAB_0040689b;
        if (uVar10 != 0x54585556) {
          if (uVar10 != 0x57474854) {
            std::operator==(&name,"APS.Level");
            pLVar15 = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[43]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp
                       ,(char (*) [43])"LWO2: Skipping unknown VMAP/VMAD channel \'");
            std::operator<<((ostream *)&temp,(string *)&name);
            std::operator<<((ostream *)&temp,"\'");
            std::__cxx11::stringbuf::str();
            Logger::warn(pLVar15,local_240._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&local_240);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&temp);
            goto LAB_0040689b;
          }
          goto LAB_00406229;
        }
        if (uVar1 != 0x200) {
          pLVar15 = DefaultLogger::get();
          std::operator+(&local_240,"LWO2: Skipping UV channel \'",&name);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp,
                         &local_240,"\' with !2 components");
          Logger::warn(pLVar15,(char *)temp._M_t.
                                       super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                                       _M_t.
                                       super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                       .super__Head_base<0UL,_float_*,_false>._M_head_impl);
          goto LAB_00406884;
        }
        base = FindEntry<Assimp::LWO::UVChannel>(&this->mCurLayer->mUVChannels,&name,perPoly);
      }
    }
  }
  lVar12 = (long)(this->mCurLayer->mTempPoints).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->mCurLayer->mTempPoints).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
  (*base->_vptr_VMapEntry[2])(base,lVar12 / 0xc & 0xffffffff,lVar12 % 0xc);
  uVar2 = base->dims;
  if ((uint)uVar9 <= base->dims) {
    uVar2 = (uint)uVar9;
  }
  inout = &this->mFileBuffer;
  this_01 = this->mCurLayer;
  this_00 = &this_01->mPointReferrers;
  paVar4 = (this_01->mTempPoints).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  paVar5 = (this_01->mTempPoints).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  pFVar6 = (this_01->mFaces).
           super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pFVar7 = (this_01->mFaces).
           super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
           super__Vector_impl_data._M_start;
  while (*inout < (uint8_t *)((long)puVar3 + (ulong)length)) {
    iVar11 = ReadVSizedIntLWO2(this,inout);
    uVar10 = iVar11 + this->mCurLayer->mPointIDXOfs;
    uVar14 = (ulong)uVar10;
    local_1b0 = (uint)(((long)paVar4 - (long)paVar5) / 0xc);
    if (uVar10 < local_1b0) {
      if (perPoly) {
        iVar11 = ReadVSizedIntLWO2(this,inout);
        uVar16 = iVar11 + this->mCurLayer->mFaceIDXOfs;
        rVar19 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&base->abAssigned,(ulong)uVar10);
        if ((*rVar19._M_p & rVar19._M_mask) != 0) {
          local_1d0 = (uint)((ulong)((long)pFVar6 - (long)pFVar7) >> 5);
          if (local_1d0 <= uVar16) {
            pLVar15 = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[38]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp
                       ,(char (*) [38])"LWO2: Failure evaluating VMAD entry \'");
            std::operator<<((ostream *)&temp,(string *)&name);
            std::operator<<((ostream *)&temp,"\', polygon index is out of range");
            std::__cxx11::stringbuf::str();
            Logger::warn(pLVar15,local_240._M_dataplus._M_p);
            goto LAB_00406619;
          }
          pFVar18 = (this_01->mFaces).
                    super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar16;
          bVar8 = false;
          for (uVar17 = 0; uVar10 = (uint)uVar14, uVar17 < (pFVar18->super_aiFace).mNumIndices;
              uVar17 = uVar17 + 1) {
            uVar10 = (pFVar18->super_aiFace).mIndices[uVar17];
            uVar13 = uVar14 & 0xffffffff;
            do {
              if ((uint)uVar13 == uVar10) {
                if (uVar10 != 0xffffffff) {
                  temp._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl._0_4_ = 0xffffffff;
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                            (this_00,((long)(this_01->mPointReferrers).
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this_01->mPointReferrers).
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 2) + 1,
                             (value_type_conflict1 *)&temp);
                  uVar14 = ((long)(this_01->mTempPoints).
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_01->mTempPoints).
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0xc;
                  (pFVar18->super_aiFace).mIndices[uVar17] = (uint)uVar14;
                  AddToSingleLinkedList(this_00,uVar10,(pFVar18->super_aiFace).mIndices[uVar17]);
                  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                            (&this_01->mTempPoints,
                             (this_01->mTempPoints).
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar10);
                  CreateNewEntry<Assimp::LWO::VColorChannel>
                            (&this->mCurLayer->mVColorChannels,uVar10);
                  CreateNewEntry<Assimp::LWO::UVChannel>(&this->mCurLayer->mUVChannels,uVar10);
                  CreateNewEntry<Assimp::LWO::WeightChannel>
                            (&this->mCurLayer->mWeightChannels,uVar10);
                  CreateNewEntry<Assimp::LWO::WeightChannel>
                            (&this->mCurLayer->mSWeightChannels,uVar10);
                  bVar8 = true;
                  CreateNewEntry<Assimp::LWO::NormalChannel>(&this->mCurLayer->mNormals,uVar10);
                }
                break;
              }
              uVar16 = (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start[uVar13];
              uVar13 = (ulong)uVar16;
            } while (uVar16 != 0xffffffff);
          }
          if (!bVar8) {
            pLVar15 = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[38]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp
                       ,(char (*) [38])"LWO2: Failure evaluating VMAD entry \'");
            std::operator<<((ostream *)&temp,(string *)&name);
            std::operator<<((ostream *)&temp,"\', vertex index wasn\'t found in that polygon");
            std::__cxx11::stringbuf::str();
            Logger::warn(pLVar15,&local_240);
            std::__cxx11::string::~string((string *)&local_240);
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *
                             )&temp);
            __assert_fail("had",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/LWO/LWOLoader.cpp"
                          ,0x467,"void Assimp::LWOImporter::LoadLWO2VertexMap(unsigned int, bool)");
          }
        }
      }
      temp._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl =
           (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
           operator_new__((ulong)(uVar2 * 4));
      for (uVar14 = 0; uVar2 != uVar14; uVar14 = uVar14 + 1) {
        uVar16 = *(uint *)*inout;
        *inout = (uint8_t *)((long)*inout + 4);
        *(uint *)((long)temp._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                        super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                        super__Head_base<0UL,_float_*,_false>._M_head_impl + uVar14 * 4) =
             uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
      }
      DoRecursiveVMAPAssignment
                (this,base,uVar2,uVar10,
                 (float *)temp._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t
                          .super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                          super__Head_base<0UL,_float_*,_false>._M_head_impl);
      *inout = *inout + (uVar9 - uVar2) * 4;
      std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&temp);
    }
    else {
      pLVar15 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[43]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp,
                 (char (*) [43])"LWO2: Failure evaluating VMAP/VMAD entry \'");
      std::operator<<((ostream *)&temp,(string *)&name);
      std::operator<<((ostream *)&temp,"\', vertex index is out of range");
      std::__cxx11::stringbuf::str();
      Logger::warn(pLVar15,local_240._M_dataplus._M_p);
LAB_00406619:
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&temp);
      *inout = *inout + (base->dims << 2);
    }
  }
LAB_0040689b:
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void LWOImporter::LoadLWO2VertexMap(unsigned int length, bool perPoly)
{
    LE_NCONST uint8_t* const end = mFileBuffer+length;

    AI_LWO_VALIDATE_CHUNK_LENGTH(length,VMAP,6);
    unsigned int type = GetU4();
    unsigned int dims = GetU2();

    VMapEntry* base;

    // read the name of the vertex map
    std::string name;
    GetS0(name,length);

    switch (type)
    {
    case AI_LWO_TXUV:
        if (dims != 2)  {
            ASSIMP_LOG_WARN("LWO2: Skipping UV channel \'"
            + name + "\' with !2 components");
            return;
        }
        base = FindEntry(mCurLayer->mUVChannels,name,perPoly);
        break;
    case AI_LWO_WGHT:
    case AI_LWO_MNVW:
        if (dims != 1)  {
            ASSIMP_LOG_WARN("LWO2: Skipping Weight Channel \'"
            + name + "\' with !1 components");
            return;
        }
        base = FindEntry((type == AI_LWO_WGHT ? mCurLayer->mWeightChannels
            : mCurLayer->mSWeightChannels),name,perPoly);
        break;
    case AI_LWO_RGB:
    case AI_LWO_RGBA:
        if (dims != 3 && dims != 4) {
            ASSIMP_LOG_WARN("LWO2: Skipping Color Map \'"
            + name + "\' with a dimension > 4 or < 3");
            return;
        }
        base = FindEntry(mCurLayer->mVColorChannels,name,perPoly);
        break;

    case AI_LWO_MODO_NORM:
        /*  This is a non-standard extension chunk used by Luxology's MODO.
         *  It stores per-vertex normals. This VMAP exists just once, has
         *  3 dimensions and is btw extremely beautiful.
         */
        if (name != "vert_normals" || dims != 3 || mCurLayer->mNormals.name.length())
            return;

        ASSIMP_LOG_INFO("Processing non-standard extension: MODO VMAP.NORM.vert_normals");

        mCurLayer->mNormals.name = name;
        base = & mCurLayer->mNormals;
        break;

    case AI_LWO_PICK: /* these VMAPs are just silently dropped */
    case AI_LWO_MORF:
    case AI_LWO_SPOT:
        return;

    default:
        if (name == "APS.Level") {
            // XXX handle this (seems to be subdivision-related).
        }
        ASSIMP_LOG_WARN_F("LWO2: Skipping unknown VMAP/VMAD channel \'", name, "\'");
        return;
    };
    base->Allocate((unsigned int)mCurLayer->mTempPoints.size());

    // now read all entries in the map
    type = std::min(dims,base->dims);
    const unsigned int diff = (dims - type)<<2u;

    LWO::FaceList& list = mCurLayer->mFaces;
    LWO::PointList& pointList = mCurLayer->mTempPoints;
    LWO::ReferrerList& refList = mCurLayer->mPointReferrers;

    const unsigned int numPoints = (unsigned int)pointList.size();
    const unsigned int numFaces  = (unsigned int)list.size();

    while (mFileBuffer < end)   {

        unsigned int idx = ReadVSizedIntLWO2(mFileBuffer) + mCurLayer->mPointIDXOfs;
        if (idx >= numPoints)   {
            ASSIMP_LOG_WARN_F("LWO2: Failure evaluating VMAP/VMAD entry \'", name, "\', vertex index is out of range");
            mFileBuffer += base->dims<<2u;
            continue;
        }
        if (perPoly)    {
            unsigned int polyIdx = ReadVSizedIntLWO2(mFileBuffer) + mCurLayer->mFaceIDXOfs;
            if (base->abAssigned[idx])  {
                // we have already a VMAP entry for this vertex - thus
                // we need to duplicate the corresponding polygon.
                if (polyIdx >= numFaces)    {
                    ASSIMP_LOG_WARN_F("LWO2: Failure evaluating VMAD entry \'", name, "\', polygon index is out of range");
                    mFileBuffer += base->dims<<2u;
                    continue;
                }

                LWO::Face& src = list[polyIdx];

                // generate a new unique vertex for the corresponding index - but only
                // if we can find the index in the face
                bool had = false;
                for (unsigned int i = 0; i < src.mNumIndices;++i)   {

                    unsigned int srcIdx = src.mIndices[i], tmp = idx;
                    do {
                        if (tmp == srcIdx)
                            break;
                    }
                    while ((tmp = refList[tmp]) != UINT_MAX);
                    if (tmp == UINT_MAX) {
                        continue;
                    }

                    had = true;
                    refList.resize(refList.size()+1, UINT_MAX);

                    idx = (unsigned int)pointList.size();
                    src.mIndices[i] = (unsigned int)pointList.size();

                    // store the index of the new vertex in the old vertex
                    // so we get a single linked list we can traverse in
                    // only one direction
                    AddToSingleLinkedList(refList,srcIdx,src.mIndices[i]);
                    pointList.push_back(pointList[srcIdx]);

                    CreateNewEntry(mCurLayer->mVColorChannels,  srcIdx );
                    CreateNewEntry(mCurLayer->mUVChannels,      srcIdx );
                    CreateNewEntry(mCurLayer->mWeightChannels,  srcIdx );
                    CreateNewEntry(mCurLayer->mSWeightChannels, srcIdx );
                    CreateNewEntry(mCurLayer->mNormals, srcIdx );
                }
                if (!had) {
                    ASSIMP_LOG_WARN_F("LWO2: Failure evaluating VMAD entry \'", name, "\', vertex index wasn't found in that polygon");
                    ai_assert(had);
                }
            }
        }

        std::unique_ptr<float[]> temp(new float[type]);
        for (unsigned int l = 0; l < type;++l)
            temp[l] = GetF4();

        DoRecursiveVMAPAssignment(base,type,idx, temp.get());
        mFileBuffer += diff;
    }
}